

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.cpp
# Opt level: O0

bool __thiscall index::find_character(index *this,wchar_t key,wchar_t value,character *ch)

{
  bool bVar1;
  pointer ppVar2;
  wchar_t in_EDX;
  _Node_iterator<std::pair<const_wchar_t,_character>,_false,_false> iter;
  pair<std::__detail::_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false>_>
  range;
  _Node_iterator_base<std::pair<const_wchar_t,_character>,_false> in_stack_ffffffffffffffc8;
  _Node_iterator_base<std::pair<const_wchar_t,_character>,_false> _Var3;
  _Node_iterator<std::pair<const_wchar_t,_character>,_false,_false> in_stack_ffffffffffffffd0;
  pair<std::__detail::_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false>_>
  local_30;
  _Node_iterator_base<std::pair<const_wchar_t,_character>,_false> local_28 [2];
  wchar_t local_18;
  
  local_18 = in_EDX;
  local_30 = std::
             unordered_multimap<wchar_t,_character,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_character>_>_>
             ::equal_range((unordered_multimap<wchar_t,_character,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_character>_>_>
                            *)in_stack_ffffffffffffffd0.
                              super__Node_iterator_base<std::pair<const_wchar_t,_character>,_false>.
                              _M_cur,(key_type *)in_stack_ffffffffffffffc8._M_cur);
  _Var3 = in_stack_ffffffffffffffd0.
          super__Node_iterator_base<std::pair<const_wchar_t,_character>,_false>._M_cur;
  while( true ) {
    bVar1 = std::__detail::operator!=
                      ((_Node_iterator_base<std::pair<const_wchar_t,_character>,_false> *)
                       &stack0xffffffffffffffc8,
                       (_Node_iterator_base<std::pair<const_wchar_t,_character>,_false> *)
                       ((long)register0x00000020 + -0x28));
    if (!bVar1) {
      return false;
    }
    ppVar2 = std::__detail::_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false> *)
                        0x1178c7);
    if ((ppVar2->second).value == local_18) break;
    std::__detail::_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false>::operator++
              ((_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false> *)
               in_stack_ffffffffffffffd0.
               super__Node_iterator_base<std::pair<const_wchar_t,_character>,_false>._M_cur);
  }
  std::__detail::_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false>::operator->
            ((_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false> *)0x1178d8);
  character::operator=
            ((character *)
             in_stack_ffffffffffffffd0.
             super__Node_iterator_base<std::pair<const_wchar_t,_character>,_false>._M_cur,
             (character *)_Var3._M_cur);
  return true;
}

Assistant:

bool index::find_character(wchar_t key, wchar_t value, character& ch)
{
    auto range = index_.equal_range(key);
    for (auto iter = range.first; iter != range.second; ++iter)
    {
        if (iter->second.value == value)
        {
            ch = iter->second;
            return true;
        }
    }
    return false;
}